

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_service_skeleton(t_cpp_generator *this,t_service *tservice)

{
  int *piVar1;
  t_function *tfunction;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  int __oflag;
  pointer pptVar4;
  t_cpp_generator *this_00;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string svcname;
  string ns;
  string local_348;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string f_skeleton_name;
  string local_1f0;
  ofstream_with_content_based_conditional_update f_skeleton;
  
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::__cxx11::string::string((string *)&svcname,(string *)CONCAT44(extraout_var,iVar2));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&ns,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_skeleton,
                 &ns,&svcname);
  std::operator+(&f_skeleton_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f_skeleton,
                 "_server.skeleton.cpp");
  std::__cxx11::string::~string((string *)&f_skeleton);
  std::__cxx11::string::~string((string *)&ns);
  this_00 = (t_cpp_generator *)(tservice->super_t_type).program_;
  std::__cxx11::string::string((string *)&local_250,"cpp",(allocator *)&f_skeleton);
  t_program::get_namespace(&local_230,(t_program *)this_00,&local_250);
  namespace_prefix(&ns,this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&f_skeleton);
  std::__cxx11::string::string
            ((string *)&local_3e8,f_skeleton_name._M_dataplus._M_p,(allocator *)&local_3c8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&f_skeleton,(char *)&local_3e8,__oflag);
  std::__cxx11::string::~string((string *)&local_3e8);
  poVar3 = std::operator<<((ostream *)&f_skeleton,
                           "// This autogenerated skeleton file illustrates how to build a server.")
  ;
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,
                           "// You should copy it to another filename to avoid overwriting it.");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"#include \"");
  get_include_prefix_abi_cxx11_
            (&local_3e8,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar3 = std::operator<<(poVar3,(string *)&local_3e8);
  poVar3 = std::operator<<(poVar3,(string *)&svcname);
  poVar3 = std::operator<<(poVar3,".h\"");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"#include <thrift/protocol/TBinaryProtocol.h>");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"#include <thrift/server/TSimpleServer.h>");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"#include <thrift/transport/TServerSocket.h>");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"#include <thrift/transport/TBufferTransports.h>");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"using namespace ::apache::thrift;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"using namespace ::apache::thrift::protocol;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"using namespace ::apache::thrift::transport;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"using namespace ::apache::thrift::server;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3e8);
  if (ns._M_string_length != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&ns);
    if (iVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&f_skeleton,"using namespace ");
      std::__cxx11::string::string((string *)&local_3e8,(string *)&ns,0,ns._M_string_length - 2);
      poVar3 = std::operator<<(poVar3,(string *)&local_3e8);
      poVar3 = std::operator<<(poVar3,";");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3e8);
    }
  }
  poVar3 = std::operator<<((ostream *)&f_skeleton,"class ");
  poVar3 = std::operator<<(poVar3,(string *)&svcname);
  poVar3 = std::operator<<(poVar3,"Handler : virtual public ");
  poVar3 = std::operator<<(poVar3,(string *)&svcname);
  poVar3 = std::operator<<(poVar3,"If {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," public:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&f_skeleton,(string *)&local_3e8);
  poVar3 = std::operator<<(poVar3,(string *)&svcname);
  poVar3 = std::operator<<(poVar3,"Handler() {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_3c8);
  poVar3 = std::operator<<(poVar3,"  // Your initialization goes here");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3a8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_3a8);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar4 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,&f_skeleton,*pptVar4);
    t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)&f_skeleton,(string *)&local_3e8);
    tfunction = *pptVar4;
    std::__cxx11::string::string((string *)&local_270,"",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_1f0,"",(allocator *)&local_2f0);
    function_signature(&local_3c8,this,tfunction,&local_270,&local_1f0,true);
    poVar3 = std::operator<<(poVar3,(string *)&local_3c8);
    poVar3 = std::operator<<(poVar3," {");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3a8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_3a8);
    poVar3 = std::operator<<(poVar3,"  // Your implementation goes here");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_348);
    poVar3 = std::operator<<(poVar3,"  printf(\"");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3,"\\n\");");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_310);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_3e8);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<((ostream *)&f_skeleton,"};");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&f_skeleton,(string *)&local_3e8);
  poVar3 = std::operator<<(poVar3,"int main(int argc, char **argv) {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3e8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_3e8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&f_skeleton,(string *)&local_3e8);
  poVar3 = std::operator<<(poVar3,"int port = 9090;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_3c8);
  poVar3 = std::operator<<(poVar3,"::std::shared_ptr<");
  poVar3 = std::operator<<(poVar3,(string *)&svcname);
  poVar3 = std::operator<<(poVar3,"Handler> handler(new ");
  poVar3 = std::operator<<(poVar3,(string *)&svcname);
  poVar3 = std::operator<<(poVar3,"Handler());");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3a8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_3a8);
  poVar3 = std::operator<<(poVar3,"::std::shared_ptr<TProcessor> processor(new ");
  poVar3 = std::operator<<(poVar3,(string *)&svcname);
  poVar3 = std::operator<<(poVar3,"Processor(handler));");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_348);
  poVar3 = std::operator<<(poVar3,
                           "::std::shared_ptr<TServerTransport> serverTransport(new TServerSocket(port));"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_310);
  poVar3 = std::operator<<(poVar3,
                           "::std::shared_ptr<TTransportFactory> transportFactory(new TBufferedTransportFactory());"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2d0);
  poVar3 = std::operator<<(poVar3,
                           "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2f0);
  poVar3 = std::operator<<(poVar3,
                           "TSimpleServer server(processor, serverTransport, transportFactory, protocolFactory);"
                          );
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_290);
  poVar3 = std::operator<<(poVar3,"server.serve();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2b0,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2b0);
  poVar3 = std::operator<<(poVar3,"return 0;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<((ostream *)&f_skeleton,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  iVar2 = 0x36bba0;
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&f_skeleton,iVar2);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&f_skeleton);
  std::__cxx11::string::~string((string *)&ns);
  std::__cxx11::string::~string((string *)&f_skeleton_name);
  std::__cxx11::string::~string((string *)&svcname);
  return;
}

Assistant:

void t_cpp_generator::generate_service_skeleton(t_service* tservice) {
  string svcname = tservice->get_name();

  // Service implementation file includes
  string f_skeleton_name = get_out_dir() + svcname + "_server.skeleton.cpp";

  string ns = namespace_prefix(tservice->get_program()->get_namespace("cpp"));

  ofstream_with_content_based_conditional_update f_skeleton;
  f_skeleton.open(f_skeleton_name.c_str());
  f_skeleton << "// This autogenerated skeleton file illustrates how to build a server." << endl
             << "// You should copy it to another filename to avoid overwriting it." << endl << endl
             << "#include \"" << get_include_prefix(*get_program()) << svcname << ".h\"" << endl
             << "#include <thrift/protocol/TBinaryProtocol.h>" << endl
             << "#include <thrift/server/TSimpleServer.h>" << endl
             << "#include <thrift/transport/TServerSocket.h>" << endl
             << "#include <thrift/transport/TBufferTransports.h>" << endl << endl
             << "using namespace ::apache::thrift;" << endl
             << "using namespace ::apache::thrift::protocol;" << endl
             << "using namespace ::apache::thrift::transport;" << endl
             << "using namespace ::apache::thrift::server;" << endl << endl;

  // the following code would not compile:
  // using namespace ;
  // using namespace ::;
  if ((!ns.empty()) && (ns.compare(" ::") != 0)) {
    f_skeleton << "using namespace " << string(ns, 0, ns.size() - 2) << ";" << endl << endl;
  }

  f_skeleton << "class " << svcname << "Handler : virtual public " << svcname << "If {" << endl
             << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "Handler() {" << endl << indent()
             << "  // Your initialization goes here" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_skeleton, *f_iter);
    f_skeleton << indent() << function_signature(*f_iter, "") << " {" << endl << indent()
               << "  // Your implementation goes here" << endl << indent() << "  printf(\""
               << (*f_iter)->get_name() << "\\n\");" << endl << indent() << "}" << endl << endl;
  }

  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << indent() << "int main(int argc, char **argv) {" << endl;
  indent_up();
  f_skeleton
      << indent() << "int port = 9090;" << endl << indent() << "::std::shared_ptr<" << svcname
      << "Handler> handler(new " << svcname << "Handler());" << endl << indent()
      << "::std::shared_ptr<TProcessor> processor(new " << svcname << "Processor(handler));" << endl
      << indent() << "::std::shared_ptr<TServerTransport> serverTransport(new TServerSocket(port));"
      << endl << indent()
      << "::std::shared_ptr<TTransportFactory> transportFactory(new TBufferedTransportFactory());" << endl
      << indent() << "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
      << endl << endl << indent()
      << "TSimpleServer server(processor, serverTransport, transportFactory, protocolFactory);"
      << endl << indent() << "server.serve();" << endl << indent() << "return 0;" << endl;
  indent_down();
  f_skeleton << "}" << endl << endl;

  // Close the files
  f_skeleton.close();
}